

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaevo.c
# Opt level: O1

int main(int argc,char **argv)

{
  nva_card *pnVar1;
  nva_card **ppnVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  int c;
  int cnum;
  uint32_t d;
  uint32_t m;
  int local_40;
  int local_3c;
  undefined4 local_38;
  uint local_34;
  
  iVar3 = nva_init();
  if (iVar3 == 0) {
    local_3c = 0;
    do {
      while (local_40 = getopt(argc,argv,"c:"), local_40 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_3c);
      }
    } while (local_40 != -1);
    if (local_3c < nva_cardsnum) {
      if (_optind + 3 <= argc) {
        __isoc99_sscanf(argv[_optind],"%d",&local_40);
        __isoc99_sscanf(argv[(long)_optind + 1],"%x",&local_34);
        __isoc99_sscanf(argv[(long)_optind + 2],"%x",&local_38);
        ppnVar2 = nva_cards;
        pnVar1 = nva_cards[local_3c];
        iVar3 = (pnVar1->chipset).chipset;
        if (iVar3 < 0xd0) {
          if (iVar3 != 0x50 && iVar3 < 0x84) {
            main_cold_4();
            return 1;
          }
          uVar6 = (ulong)(local_40 * 8 + 0x610300);
          uVar5 = *(uint *)((long)pnVar1->bar0 + uVar6);
          *(uint *)((long)pnVar1->bar0 + uVar6) = uVar5 | 1;
          *(undefined4 *)((long)ppnVar2[local_3c]->bar0 + (ulong)(local_40 * 8 + 0x610304)) =
               local_38;
          *(uint *)((long)ppnVar2[local_3c]->bar0 + (ulong)(local_40 * 8 + 0x610300)) =
               local_34 | 0x80000001;
          uVar6 = (ulong)(local_40 * 8 + 0x610300);
          pvVar4 = ppnVar2[local_3c]->bar0;
          do {
          } while (*(int *)((long)pvVar4 + uVar6) < 0);
        }
        else {
          uVar6 = (ulong)(local_40 * 8 + 0x610700);
          uVar5 = *(uint *)((long)pnVar1->bar0 + uVar6);
          *(uint *)((long)pnVar1->bar0 + uVar6) = uVar5 | 1;
          *(undefined4 *)((long)ppnVar2[local_3c]->bar0 + (ulong)(local_40 * 8 + 0x610704)) =
               local_38;
          *(uint *)((long)ppnVar2[local_3c]->bar0 + (ulong)(local_40 * 8 + 0x610700)) =
               local_34 | 0x80000001;
          uVar6 = (ulong)(local_40 * 8 + 0x610700);
          pvVar4 = ppnVar2[local_3c]->bar0;
          do {
          } while (*(int *)((long)pvVar4 + uVar6) < 0);
        }
        *(uint *)((long)pvVar4 + uVar6) = uVar5;
        return 0;
      }
      main_cold_5();
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	uint32_t m, d, ctrl;
	if (optind + 3 > argc) {
		fprintf (stderr, "%s: <channel> <method> <data>\n", argv[0]);
		return 1;
	}
	sscanf (argv[optind + 0], "%d", &c);
	sscanf (argv[optind + 1], "%x", &m);
	sscanf (argv[optind + 2], "%x", &d);

	if (nva_cards[cnum]->chipset.chipset >= 0xd0) {
		ctrl = nva_rd32(cnum, 0x610700 + (c * 8));
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610704 + (c * 8), d);
		nva_wr32(cnum, 0x610700 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610700 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl);
	} else
	if (nva_cards[cnum]->chipset.chipset == 0x50 ||
	    nva_cards[cnum]->chipset.chipset >= 0x84) {
		ctrl = nva_rd32(cnum, 0x610300 + (c * 8));
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610304 + (c * 8), d);
		nva_wr32(cnum, 0x610300 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610300 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl);
	} else {
		fprintf (stderr, "unsupported chipset\n");
		return 1;
	}

	return 0;
}